

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triplets.h
# Opt level: O2

void __thiscall
iDynTree::Triplets::addSubMatrix<6u,6u>
          (Triplets *this,size_t startingRow,size_t startingColumn,MatrixFixSize<6U,_6U> *matrix)

{
  long lVar1;
  size_t col;
  long lVar2;
  Triplet local_48 [24];
  
  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::reserve
            (&this->m_triplets,
             ((long)(this->m_triplets).
                    super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_triplets).
                   super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl
                   .super__Vector_impl_data._M_start) / 0x18 + 0x24);
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
      iDynTree::Triplet::Triplet
                (local_48,lVar1 + startingRow,startingColumn + lVar2,
                 *(double *)((long)matrix + lVar2 * 8));
      std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::
      emplace_back<iDynTree::Triplet>(&this->m_triplets,local_48);
    }
    matrix = (MatrixFixSize<6U,_6U> *)((long)matrix + 0x30);
  }
  return;
}

Assistant:

inline void addSubMatrix(std::size_t startingRow,
                             std::size_t startingColumn,
                             const MatrixFixSize<rows, cols> &matrix)
    {
        //if enough memory has been reserved this should be a noop
        m_triplets.reserve(m_triplets.size() + (rows * cols));
        for (std::size_t row = 0; row < rows; ++row) {
            for (std::size_t col = 0; col < cols; ++col) {
                m_triplets.push_back(Triplet(startingRow + row, startingColumn + col, matrix(row, col)));
            }
        }
    }